

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.hpp
# Opt level: O2

void Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parseIfCase
               (char *content,SizeT *offset,SizeT end_offset,SizeT *case_offset,
               SizeT *case_end_offset)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  SizeT SVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar9 = (ulong)*offset;
  uVar8 = (ulong)end_offset;
  while( true ) {
    if (uVar8 <= uVar9) {
      return;
    }
    if (content[uVar9] != ' ') break;
    uVar9 = uVar9 + 1;
    *offset = (SizeT)uVar9;
  }
  if (end_offset - (int)uVar9 < 5) {
    return;
  }
  bVar3 = StringUtils::IsEqual<char>(content + (uVar9 & 0xffffffff),"case",4);
  if (!bVar3) {
    return;
  }
  uVar7 = uVar9 + 5;
  uVar9 = uVar9 + 4 & 0xffffffff;
  do {
    uVar5 = uVar7 & 0xffffffff;
    *offset = (int)uVar7 - 1;
    if (uVar8 <= uVar9) break;
    pcVar1 = content + uVar9;
    uVar9 = uVar9 + 1;
    uVar7 = (ulong)((int)uVar7 + 1);
  } while (*pcVar1 != '=');
  do {
    uVar4 = (uint)uVar5;
    *offset = uVar4;
    if (end_offset <= uVar4) {
      return;
    }
    cVar2 = content[uVar5];
    uVar4 = uVar4 + 1;
    uVar5 = (ulong)uVar4;
  } while (cVar2 == ' ');
  *offset = uVar4;
  *case_offset = uVar4;
  uVar4 = *offset;
  uVar9 = (ulong)uVar4;
  SVar6 = end_offset;
  if (end_offset < uVar4) {
    SVar6 = uVar4;
  }
  while (uVar9 < uVar8) {
    if (content[uVar9] == cVar2) {
      SVar6 = (SizeT)uVar9;
      break;
    }
    uVar9 = uVar9 + 1;
    *offset = (SizeT)uVar9;
  }
  *case_end_offset = SVar6;
  uVar4 = *offset;
  uVar9 = (ulong)uVar4;
  if (end_offset < uVar4) {
    end_offset = uVar4;
  }
  do {
    if (uVar8 <= uVar9) {
LAB_0010f80a:
      *offset = end_offset + 1;
      return;
    }
    if (content[uVar9] == '>') {
      end_offset = (SizeT)uVar9;
      goto LAB_0010f80a;
    }
    uVar9 = uVar9 + 1;
    *offset = (SizeT)uVar9;
  } while( true );
}

Assistant:

inline static void parseIfCase(const Char_T *content, SizeT &offset, const SizeT end_offset, SizeT &case_offset,
                                   SizeT &case_end_offset) noexcept {
        while ((offset < end_offset) && (content[offset] == TagPatterns::SpaceChar)) {
            ++offset;
        }

        if ((offset < end_offset) && ((end_offset - offset) > TagPatterns::CaseLength) &&
            StringUtils::IsEqual((content + offset), TagPatterns::Case, TagPatterns::CaseLength)) {
            offset += TagPatterns::CaseLength;

            while ((offset < end_offset) && (content[offset] != TagPatterns::EqualChar)) {
                ++offset;
            }

            do {
                ++offset;
            } while ((offset < end_offset) && (content[offset] == TagPatterns::SpaceChar));

            if (offset < end_offset) {
                const Char_T quote_char = content[offset];

                ++offset;

                case_offset = offset;

                while ((offset < end_offset) && (content[offset] != quote_char)) {
                    ++offset;
                }

                case_end_offset = offset;

                while ((offset < end_offset) && (content[offset] != TagPatterns::MultiLineLastChar)) {
                    ++offset;
                }

                ++offset;
            }
        }
    }